

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O2

TValue * debug_localname(lua_State *L,lua_Debug *ar,char **name,BCReg slot1)

{
  TValue *pTVar1;
  uint64_t uVar2;
  BCPos pc;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  TValue *pTVar6;
  uint uVar7;
  cTValue *nextframe;
  GCfunc *fn;
  
  uVar7 = ar->i_ci;
  pTVar1 = (TValue *)((L->stack).ptr64 + (ulong)(uVar7 & 0xffff) * 8);
  pTVar6 = pTVar1 + (uVar7 >> 0x10);
  nextframe = (cTValue *)0x0;
  if (0xffff < uVar7) {
    nextframe = pTVar6;
  }
  fn = (GCfunc *)(pTVar1[-1].u64 & 0x7fffffffffff);
  pc = debug_framepc(L,fn,nextframe);
  if (nextframe == (cTValue *)0x0) {
    pTVar6 = L->top + 1;
  }
  if ((int)slot1 < 0) {
    if ((pc == 0xffffffff) || (uVar2 = (fn->c).pc.ptr64, (*(byte *)(uVar2 - 0x2b) & 2) == 0)) {
      return (TValue *)0x0;
    }
    uVar4 = (ulong)(*(byte *)(uVar2 - 0x5e) - slot1);
    uVar7 = (pTVar1->u32).lo & 7;
    if (uVar7 == 3) {
      pTVar6 = pTVar1;
    }
    lVar5 = -((ulong)pTVar1->u32 & 0xfffffffffffffff8);
    if (uVar7 != 3) {
      lVar5 = 0;
    }
    if (pTVar6 <= (TValue *)((long)pTVar1 + uVar4 * 8 + lVar5 + 8)) {
      return (TValue *)0x0;
    }
    *name = "(*vararg)";
    return (TValue *)((long)pTVar1 + uVar4 * 8 + lVar5);
  }
  if (pc == 0xffffffff) {
    if (slot1 == 0) goto LAB_00112eaf;
  }
  else {
    pcVar3 = debug_varname((GCproto *)((fn->c).pc.ptr64 - 0x68),pc,slot1 - 1);
    *name = pcVar3;
    if ((slot1 == 0) || (pcVar3 != (char *)0x0)) goto LAB_00112eaf;
  }
  if (pTVar1 + (ulong)slot1 + 1 < pTVar6) {
    *name = "(*temporary)";
  }
LAB_00112eaf:
  return pTVar1 + slot1;
}

Assistant:

static TValue *debug_localname(lua_State *L, const lua_Debug *ar,
			       const char **name, BCReg slot1)
{
  uint32_t offset = (uint32_t)ar->i_ci & 0xffff;
  uint32_t size = (uint32_t)ar->i_ci >> 16;
  TValue *frame = tvref(L->stack) + offset;
  TValue *nextframe = size ? frame + size : NULL;
  GCfunc *fn = frame_func(frame);
  BCPos pc = debug_framepc(L, fn, nextframe);
  if (!nextframe) nextframe = L->top+LJ_FR2;
  if ((int)slot1 < 0) {  /* Negative slot number is for varargs. */
    if (pc != NO_BCPOS) {
      GCproto *pt = funcproto(fn);
      if ((pt->flags & PROTO_VARARG)) {
	slot1 = pt->numparams + (BCReg)(-(int)slot1);
	if (frame_isvarg(frame)) {  /* Vararg frame has been set up? (pc!=0) */
	  nextframe = frame;
	  frame = frame_prevd(frame);
	}
	if (frame + slot1+LJ_FR2 < nextframe) {
	  *name = "(*vararg)";
	  return frame+slot1;
	}
      }
    }
    return NULL;
  }
  if (pc != NO_BCPOS &&
      (*name = debug_varname(funcproto(fn), pc, slot1-1)) != NULL)
    ;
  else if (slot1 > 0 && frame + slot1+LJ_FR2 < nextframe)
    *name = "(*temporary)";
  return frame+slot1;
}